

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

qint64 __thiscall QFSFileEnginePrivate::writeFdFh(QFSFileEnginePrivate *this,char *data,qint64 len)

{
  byte *pbVar1;
  int iVar2;
  QAbstractFileEngine *this_00;
  size_t sVar3;
  ssize_t sVar4;
  int *piVar5;
  FILE *__s;
  qint64 qVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  if (len < 0) {
    QSystemError::stdString((QString *)&local_50,0x16);
    QAbstractFileEngine::setError(this_00,WriteError,(QString *)&local_50);
    goto LAB_0013c261;
  }
  if (len == 0) {
    qVar6 = 0;
  }
  else {
    __s = (FILE *)this->fh;
    if (__s != (FILE *)0x0) {
      qVar6 = 0;
      do {
        sVar3 = fwrite(data + qVar6,1,len - qVar6,__s);
        qVar6 = qVar6 + sVar3;
        if (sVar3 == 0) {
          piVar5 = __errno_location();
          if (*piVar5 != 4) goto LAB_0013c220;
        }
        else if (len <= qVar6) goto LAB_0013c220;
        __s = (FILE *)this->fh;
      } while( true );
    }
    if (this->fd == -1) goto LAB_0013c22c;
    qVar6 = 0;
    do {
      sVar3 = len - qVar6;
      if (0x7ffffffffffffffe < sVar3) {
        sVar3 = 0x7fffffffffffffff;
      }
      iVar2 = this->fd;
      while (sVar4 = write(iVar2,data + qVar6,sVar3), sVar4 == -1) {
        piVar5 = __errno_location();
        if (*piVar5 != 4) goto LAB_0013c220;
      }
      if (sVar4 < 1) goto LAB_0013c220;
      qVar6 = qVar6 + sVar4;
    } while (qVar6 < len);
  }
  goto LAB_0013c225;
LAB_0013c220:
  if (qVar6 == 0) {
LAB_0013c22c:
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    QSystemError::stdString((QString *)&local_50,iVar2);
    QAbstractFileEngine::setError
              (this_00,(uint)(iVar2 == 0x1c) * 2 + WriteError,(QString *)&local_50);
LAB_0013c261:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    qVar6 = -1;
    goto LAB_0013c26a;
  }
LAB_0013c225:
  pbVar1 = (byte *)((long)&(this->metaData).knownFlagsMask.
                           super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                           super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
  *pbVar1 = *pbVar1 & 0xdf;
LAB_0013c26a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return qVar6;
}

Assistant:

qint64 QFSFileEnginePrivate::writeFdFh(const char *data, qint64 len)
{
    Q_Q(QFSFileEngine);

    if (len < 0 || len != qint64(size_t(len))) {
        q->setError(QFile::WriteError, QSystemError::stdString(EINVAL));
        return -1;
    }

    qint64 writtenBytes = 0;

    if (len) { // avoid passing nullptr to fwrite() or QT_WRITE() (UB)

        if (fh) {
            // Buffered stdlib mode.

            size_t result;
            do {
                result = fwrite(data + writtenBytes, 1, size_t(len - writtenBytes), fh);
                writtenBytes += result;
            } while (result == 0 ? errno == EINTR : writtenBytes < len);

        } else if (fd != -1) {
            // Unbuffered stdio mode.

            SignedIOType result;
            do {
                // calculate the chunk size
                // on Windows or 32-bit no-largefile Unix, we'll need to read in chunks
                // we limit to the size of the signed type, otherwise we could get a negative number as a result
                quint64 wantedBytes = quint64(len) - quint64(writtenBytes);
                UnsignedIOType chunkSize = std::numeric_limits<SignedIOType>::max();
                if (chunkSize > wantedBytes)
                    chunkSize = wantedBytes;
                result = QT_WRITE(fd, data + writtenBytes, chunkSize);
            } while (result > 0 && (writtenBytes += result) < len);
        }

    }

    if (len &&  writtenBytes == 0) {
        writtenBytes = -1;
        q->setError(errno == ENOSPC ? QFile::ResourceError : QFile::WriteError,
                    QSystemError::stdString(errno));
    } else {
        // reset the cached size, if any
        metaData.clearFlags(QFileSystemMetaData::SizeAttribute);
    }

    return writtenBytes;
}